

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_to_compressed_c.cpp
# Opt level: O2

stb_uint stb_compress(stb_uchar *out,stb_uchar *input,stb_uint length)

{
  byte bVar1;
  byte bVar2;
  stb_uchar *psVar3;
  stb_uint maxlen;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  void *__ptr;
  long lVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  uchar v;
  byte *pbVar12;
  stb_uchar v_00;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  byte *m2;
  byte *local_88;
  
  stb__out = out;
  __ptr = malloc(0x40000);
  iVar26 = (int)out;
  if (__ptr == (void *)0x0) goto LAB_00101ea9;
  for (lVar8 = 0; lVar8 != 0x8000; lVar8 = lVar8 + 1) {
    *(undefined8 *)((long)__ptr + lVar8 * 8) = 0;
  }
  if (out == (stb_uchar *)0x0) {
    stb__write('W');
    if (stb__out == (stb_uchar *)0x0) {
      stb__write(0xbc);
      goto LAB_001016cf;
    }
  }
  else {
    stb__out = out + 1;
    *out = 'W';
  }
  psVar3 = stb__out + 1;
  *stb__out = 0xbc;
  stb__out = psVar3;
LAB_001016cf:
  stb_out2(0);
  stb_out4(0);
  stb_out4(length);
  stb_out4(0x40000);
  stb__running_adler = 1;
  pbVar12 = input + length;
  pbVar9 = input;
  local_88 = input;
LAB_00101722:
  do {
    m2 = pbVar9;
    iVar26 = (int)local_88;
    if ((input + (int)length <= m2) || (pbVar12 <= m2 + 0xc)) goto LAB_00101d62;
    iVar16 = (int)m2;
    maxlen = (int)pbVar12 - iVar16;
    if (m2 + 0x10000 <= pbVar12) {
      maxlen = 0x10000;
    }
    uVar22 = (uint)m2[2] + (uint)m2[1] * 0x80 + (uint)*m2 * 0x4000;
    uVar23 = (ulong)((uVar22 >> 0x10) + uVar22 & 0x7fff);
    psVar3 = *(stb_uchar **)((long)__ptr + uVar23 * 8);
    iVar5 = 0;
    if (psVar3 == (stb_uchar *)0x0) {
      uVar24 = 2;
    }
    else {
      uVar4 = stb_matchlen(psVar3,m2,maxlen);
      if ((int)uVar4 < 3) {
        uVar24 = 2;
        iVar5 = 0;
      }
      else {
        uVar17 = (long)m2 - (long)psVar3;
        iVar5 = 0;
        uVar24 = 2;
        if ((long)uVar17 < 0x40001) {
          if (uVar4 < 10) {
            iVar5 = stb_not_crap(uVar4,(int)uVar17);
            if (iVar5 == 0) {
              uVar4 = 2;
            }
            uVar17 = uVar17 & 0xffffffff;
            if (iVar5 == 0) {
              uVar17 = 0;
            }
          }
          iVar5 = (int)uVar17;
          uVar24 = uVar4;
        }
      }
    }
    uVar4 = (uint)m2[4] + (uint)m2[3] * 0x80 + (uVar22 * 0x4000 | uVar22 >> 0x12);
    uVar17 = (ulong)((uVar4 >> 0x10) + uVar4 & 0x7fff);
    bVar1 = m2[5];
    bVar2 = m2[6];
    psVar3 = *(stb_uchar **)((long)__ptr + uVar17 * 8);
    iVar18 = iVar5;
    uVar22 = uVar24;
    if (((((psVar3 != (stb_uchar *)0x0) && (lVar8 = (long)m2 - (long)psVar3, lVar8 != iVar5)) &&
         (uVar6 = stb_matchlen(psVar3,m2,maxlen), lVar8 < 0x40001)) &&
        (((int)uVar24 < (int)uVar6 &&
         (iVar25 = (int)lVar8, iVar18 = iVar25, uVar22 = uVar6, uVar6 < 10)))) &&
       (iVar7 = stb_not_crap(uVar6,iVar25), iVar18 = iVar5, uVar22 = uVar24, iVar7 != 0)) {
      iVar18 = iVar25;
      uVar22 = uVar6;
    }
    uVar24 = (uint)bVar1 * 0x80 + (uint)bVar2 + (uVar4 * 0x4000 | uVar4 >> 0x12);
    uVar4 = (uint)m2[8] + (uint)m2[7] * 0x80 + (uVar24 * 0x4000 | uVar24 >> 0x12);
    uVar19 = (ulong)((uVar4 >> 0x10) + uVar4 & 0x7fff);
    bVar1 = m2[9];
    bVar2 = m2[10];
    psVar3 = *(stb_uchar **)((long)__ptr + uVar19 * 8);
    iVar5 = iVar18;
    uVar24 = uVar22;
    if (((psVar3 != (stb_uchar *)0x0) && (lVar8 = (long)m2 - (long)psVar3, lVar8 != iVar18)) &&
       ((uVar6 = stb_matchlen(psVar3,m2,maxlen), lVar8 < 0x40001 &&
        ((((int)uVar22 < (int)uVar6 &&
          (iVar25 = (int)lVar8, iVar5 = iVar25, uVar24 = uVar6, uVar6 < 10)) &&
         (iVar7 = stb_not_crap(uVar6,iVar25), iVar5 = iVar18, uVar24 = uVar22, iVar7 != 0)))))) {
      iVar5 = iVar25;
      uVar24 = uVar6;
    }
    uVar22 = (uint)bVar1 * 0x80 + (uint)bVar2 + (uVar4 * 0x4000 | uVar4 >> 0x12);
    uVar22 = (uint)m2[0xc] + (uint)m2[0xb] * 0x80 + (uVar22 * 0x4000 | uVar22 >> 0x12);
    uVar21 = (ulong)((uVar22 >> 0x10) + uVar22 & 0x7fff);
    psVar3 = *(stb_uchar **)((long)__ptr + uVar21 * 8);
    iVar18 = iVar5;
    uVar22 = uVar24;
    if ((((psVar3 != (stb_uchar *)0x0) && (lVar8 = (long)m2 - (long)psVar3, lVar8 != iVar5)) &&
        ((uVar4 = stb_matchlen(psVar3,m2,maxlen), lVar8 < 0x40001 &&
         (((int)uVar24 < (int)uVar4 &&
          (iVar25 = (int)lVar8, iVar18 = iVar25, uVar22 = uVar4, uVar4 < 10)))))) &&
       (iVar7 = stb_not_crap(uVar4,iVar25), iVar18 = iVar5, uVar22 = uVar24, iVar7 != 0)) {
      iVar18 = iVar25;
      uVar22 = uVar4;
    }
    *(byte **)((long)__ptr + uVar21 * 8) = m2;
    *(byte **)((long)__ptr + uVar19 * 8) = m2;
    *(byte **)((long)__ptr + uVar17 * 8) = m2;
    *(byte **)((long)__ptr + uVar23 * 8) = m2;
    if ((2 < uVar22) && (iVar18 < 1)) {
      __assert_fail("dist > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/misc/fonts/binary_to_compressed_c.cpp"
                    ,0x125,
                    "int stb_compress_chunk(stb_uchar *, stb_uchar *, stb_uchar *, int, int *, stb_uchar **, stb_uint)"
                   );
    }
    pbVar9 = m2 + 1;
  } while (uVar22 < 3);
  if ((0x80 < uVar22) || (0x100 < iVar18)) {
    if ((uVar22 - 6 < 0xfb) && (iVar18 < 0x4001)) {
      outliterals(local_88,iVar16 - iVar26);
      stb_out2(iVar18 + 0x3fff);
LAB_00101b45:
      local_88 = m2 + uVar22;
      v_00 = (char)uVar22 + 0xff;
      if (stb__out != (stb_uchar *)0x0) {
        psVar3 = stb__out + 1;
        *stb__out = v_00;
        stb__out = psVar3;
        pbVar9 = local_88;
        goto LAB_00101722;
      }
    }
    else {
      if ((uVar22 - 8 < 0xf9) && (iVar18 < 0x80001)) {
        outliterals(local_88,iVar16 - iVar26);
        stb_out3(iVar18 + 0x17ffff);
        goto LAB_00101b45;
      }
      if ((uVar22 - 9 < 0xfff8) && (iVar18 < 0x80001)) {
        outliterals(local_88,iVar16 - iVar26);
        local_88 = m2 + uVar22;
        stb_out3(iVar18 + 0xfffff);
        stb_out2(uVar22 - 1);
        pbVar9 = local_88;
        goto LAB_00101722;
      }
      if ((uVar22 < 10) || (0x1000000 < iVar18)) goto LAB_00101722;
      uVar23 = 0x10000;
      if (uVar22 < 0x10000) {
        uVar23 = (ulong)uVar22;
      }
      outliterals(local_88,iVar16 - iVar26);
      local_88 = m2 + uVar23;
      pbVar9 = local_88;
      if (0x100 < uVar22) {
        if (stb__out == (stb_uchar *)0x0) {
          stb__write('\x04');
        }
        else {
          psVar3 = stb__out + 1;
          *stb__out = '\x04';
          stb__out = psVar3;
        }
        stb_out3(iVar18 - 1);
        stb_out2((int)uVar23 - 1);
        goto LAB_00101722;
      }
      if (stb__out == (stb_uchar *)0x0) {
        stb__write('\x06');
      }
      else {
        psVar3 = stb__out + 1;
        *stb__out = '\x06';
        stb__out = psVar3;
      }
      stb_out3(iVar18 - 1);
      v_00 = (char)uVar23 + 0xff;
      if (stb__out != (stb_uchar *)0x0) {
        psVar3 = stb__out + 1;
        *stb__out = v_00;
        stb__out = psVar3;
        goto LAB_00101722;
      }
    }
    stb__write(v_00);
    pbVar9 = local_88;
    goto LAB_00101722;
  }
  outliterals(local_88,iVar16 - iVar26);
  local_88 = m2 + uVar22;
  v = (char)uVar22 + '\x7f';
  pbVar9 = local_88;
  if (stb__out == (stb_uchar *)0x0) {
    stb__write(v);
    if (stb__out == (stb_uchar *)0x0) {
      stb__write((char)iVar18 + 0xff);
      goto LAB_00101722;
    }
  }
  else {
    *stb__out = v;
    stb__out = stb__out + 1;
  }
  psVar3 = stb__out + 1;
  *stb__out = (char)iVar18 + 0xff;
  stb__out = psVar3;
  goto LAB_00101722;
LAB_00101d62:
  pbVar9 = input + (int)length;
  if ((long)(int)length <= (long)m2 - (long)input) {
    pbVar9 = m2;
  }
  uVar24 = (int)pbVar9 - (int)input;
  uVar17 = (ulong)(stb__running_adler & 0xffff);
  uVar19 = (ulong)(stb__running_adler >> 0x10);
  uVar23 = (ulong)uVar24 % 0x15b0;
  for (uVar22 = uVar24; uVar22 != 0; uVar22 = uVar22 - iVar16) {
    for (uVar21 = 0; uVar21 + 7 < uVar23; uVar21 = uVar21 + 8) {
      lVar20 = uVar17 + input[uVar21];
      lVar8 = (ulong)input[uVar21 + 1] + lVar20;
      lVar13 = (ulong)input[uVar21 + 2] + lVar8;
      lVar10 = (ulong)input[uVar21 + 3] + lVar13;
      lVar14 = (ulong)input[uVar21 + 4] + lVar10;
      lVar11 = (ulong)input[uVar21 + 5] + lVar14;
      lVar15 = (ulong)input[uVar21 + 6] + lVar11;
      uVar17 = (ulong)input[uVar21 + 7] + lVar15;
      uVar19 = uVar19 + lVar20 + lVar8 + lVar13 + lVar10 + lVar14 + lVar11 + lVar15 + uVar17;
    }
    for (; uVar21 < uVar23; uVar21 = uVar21 + 1) {
      uVar17 = uVar17 + input[uVar21];
      uVar19 = uVar19 + uVar17;
    }
    uVar17 = uVar17 % 0xfff1;
    uVar19 = uVar19 % 0xfff1;
    iVar16 = (int)uVar23;
    input = input + uVar21;
    uVar23 = 0x15b0;
  }
  stb__running_adler = (int)uVar17 + (int)uVar19 * 0x10000;
  if (uVar24 != length) {
    __assert_fail("len == length",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/misc/fonts/binary_to_compressed_c.cpp"
                  ,0x16c,"int stb_compress_inner(stb_uchar *, stb_uint)");
  }
  iVar26 = (int)pbVar9 - iVar26;
  outliterals(pbVar12 + -(long)iVar26,iVar26);
  free(__ptr);
  stb_out2(0x5fa);
  stb_out4(stb__running_adler);
  iVar26 = (int)stb__out;
LAB_00101ea9:
  return iVar26 - (int)out;
}

Assistant:

stb_uint stb_compress(stb_uchar *out, stb_uchar *input, stb_uint length)
{
    stb__out = out;
    stb__outfile = NULL;

    stb_compress_inner(input, length);

    return stb__out - out;
}